

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall ExprVisitorTest_InvalidExpr_Test::TestBody(ExprVisitorTest_InvalidExpr_Test *this)

{
  linked_ptr_internal *plVar1;
  MockAllocator *this_00;
  bool bVar2;
  MockSpec<void_*(unsigned_long)> *pMVar3;
  TypedExpectation<void_*(unsigned_long)> *pTVar4;
  NumericConstant e;
  LogicalConstant e_00;
  linked_ptr_internal *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *message_00;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  char buffer [100];
  BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> f;
  NiceMock<MockAllocator> alloc;
  ActionInterface<void_*(unsigned_long)> *local_210;
  linked_ptr_internal local_208;
  AssertHelper local_200;
  Matcher<unsigned_long> local_1f8;
  ExprVisitorTest_InvalidExpr_Test *local_1d8;
  _func_int *local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined4 local_168;
  BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> local_160;
  NiceMock<MockAllocator> local_120;
  
  local_1d8 = this;
  testing::NiceMock<MockAllocator>::NiceMock(&local_120);
  local_160._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_001e6a08;
  local_160.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_160.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_160.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_160.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_160.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_160.super_AllocatorRef<testing::NiceMock<MockAllocator>,_char>.alloc_ = &local_120;
  local_1f8.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)operator_new(8);
  this_00 = &local_120.super_MockAllocator;
  ((local_1f8.super_MatcherBase<unsigned_long>.impl_.value_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_001e6a60;
  plVar1 = &local_1f8.super_MatcherBase<unsigned_long>.impl_.link_;
  local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e40c0;
  local_1f8.super_MatcherBase<unsigned_long>.impl_.link_.next_ = plVar1;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,this_00);
  pMVar3 = testing::internal::FunctionMocker<void_*(unsigned_long)>::With
                     (&this_00->gmock1_allocate_38,&local_1f8);
  pTVar4 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                      ,0x231,"alloc","allocate(_)");
  local_210 = (ActionInterface<void_*(unsigned_long)> *)operator_new(0x10);
  local_210->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e6bb0;
  local_210[1]._vptr_ActionInterface = &local_1c8;
  local_208.next_ = &local_208;
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillOnce
            (pTVar4,(Action<void_*(unsigned_long)> *)&local_210);
  testing::internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> *)&local_210);
  local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e4108;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_1f8.super_MatcherBase<unsigned_long>.impl_);
  e = mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::
      MakeNumericConstant(&local_160,0.0);
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = (_func_int *)0x0;
  uStack_1c0 = 0;
  local_168 = 0;
  testing::AssertionSuccess();
  if (local_210._0_1_ == true) {
    local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)plVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"invalid expression","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &(local_1d8->super_ExprVisitorTest).visitor_,
                 (Expr)e.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_)
      ;
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_210,
               (char (*) [104])
               "Expected: visitor_.Visit(e1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((linked_ptr_internal *)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        plVar1) {
      operator_delete(local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase,
                      (ulong)((long)&(local_1f8.super_MatcherBase<unsigned_long>.impl_.link_.next_)
                                     ->next_ + 1));
    }
  }
  testing::Message::Message((Message *)&local_1f8);
  if (local_208.next_ == (linked_ptr_internal *)0x0) {
    message = (linked_ptr_internal *)0x1aaadd;
  }
  else {
    message = (local_208.next_)->next_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_200,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x234,(char *)message);
  testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
  testing::internal::AssertHelper::~AssertHelper(&local_200);
  if ((((linked_ptr_internal *)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        (linked_ptr_internal *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((linked_ptr_internal *)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
      (linked_ptr_internal *)0x0)) {
    (*(code *)(*(linked_ptr_internal **)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase
              )[1].next_)();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_208,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1f8.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)operator_new(8);
  ((local_1f8.super_MatcherBase<unsigned_long>.impl_.value_)->super_MatcherDescriberInterface).
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherDescriberInterface_001e6a60;
  local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e40c0;
  local_1f8.super_MatcherBase<unsigned_long>.impl_.link_.next_ = plVar1;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,this_00);
  pMVar3 = testing::internal::FunctionMocker<void_*(unsigned_long)>::With
                     (&this_00->gmock1_allocate_38,&local_1f8);
  pTVar4 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                     (pMVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                      ,0x238,"alloc","allocate(_)");
  local_210 = (ActionInterface<void_*(unsigned_long)> *)operator_new(0x10);
  local_210->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001e6bb0;
  local_210[1]._vptr_ActionInterface = &local_1c8;
  local_208.next_ = &local_208;
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillOnce
            (pTVar4,(Action<void_*(unsigned_long)> *)&local_210);
  testing::internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> *)&local_210);
  local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e4108;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr
            (&local_1f8.super_MatcherBase<unsigned_long>.impl_);
  e_00 = mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::
         MakeLogicalConstant(&local_160,false);
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1c8 = (_func_int *)0x0;
  uStack_1c0 = 0;
  local_168 = 0;
  testing::AssertionSuccess();
  if (local_210._0_1_ == true) {
    local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase = (_func_int **)plVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"invalid expression","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &(local_1d8->super_ExprVisitorTest).visitor_,
                 (Expr)e_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                       impl_);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_210,
               (char (*) [104])
               "Expected: visitor_.Visit(e2) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((linked_ptr_internal *)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        plVar1) {
      operator_delete(local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase,
                      (ulong)((long)&(local_1f8.super_MatcherBase<unsigned_long>.impl_.link_.next_)
                                     ->next_ + 1));
    }
  }
  testing::Message::Message((Message *)&local_1f8);
  if (local_208.next_ == (linked_ptr_internal *)0x0) {
    message_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aaadd;
  }
  else {
    message_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_208.next_)->next_;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_200,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x23b,(char *)message_00);
  testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1f8);
  testing::internal::AssertHelper::~AssertHelper(&local_200);
  if ((((linked_ptr_internal *)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
        (linked_ptr_internal *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((linked_ptr_internal *)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase !=
      (linked_ptr_internal *)0x0)) {
    (*(code *)(*(linked_ptr_internal **)local_1f8.super_MatcherBase<unsigned_long>._vptr_MatcherBase
              )[1].next_)();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_208,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::~BasicExprFactory
            (&local_160);
  testing::NiceMock<MockAllocator>::~NiceMock(&local_120);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, InvalidExpr) {
  using ::testing::_;
  typedef AllocatorRef< ::testing::NiceMock<MockAllocator> > Allocator;
  ::testing::NiceMock<MockAllocator> alloc;
  char buffer[100];
  mp::BasicExprFactory<Allocator> f((Allocator(&alloc)));

  // Corrupt a numeric expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e1 = f.MakeNumericConstant(0);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e1), "invalid expression");

  // Corrupt a logical expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e2 = f.MakeLogicalConstant(false);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e2), "invalid expression");
}